

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.h
# Opt level: O3

SampledSpectrum __thiscall
pbrt::ImageInfiniteLight::Le(ImageInfiniteLight *this,Ray *ray,SampledWavelengths *lambda)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  Point2f uv;
  undefined1 auVar3 [16];
  float fVar4;
  float fVar5;
  float fVar6;
  undefined1 auVar7 [16];
  float fVar8;
  Vector3f d;
  SampledSpectrum SVar9;
  
  fVar4 = (ray->d).super_Tuple3<pbrt::Vector3,_float>.y;
  fVar5 = (ray->d).super_Tuple3<pbrt::Vector3,_float>.x;
  fVar6 = (ray->d).super_Tuple3<pbrt::Vector3,_float>.z;
  auVar3 = vfmadd231ss_fma(ZEXT416((uint)(fVar4 * (this->super_LightBase).renderFromLight.mInv.m[0]
                                                  [1])),ZEXT416((uint)fVar5),
                           ZEXT416((uint)(this->super_LightBase).renderFromLight.mInv.m[0][0]));
  auVar1 = vfmadd231ss_fma(ZEXT416((uint)(fVar4 * (this->super_LightBase).renderFromLight.mInv.m[1]
                                                  [1])),ZEXT416((uint)fVar5),
                           ZEXT416((uint)(this->super_LightBase).renderFromLight.mInv.m[1][0]));
  auVar7 = vfmadd231ss_fma(ZEXT416((uint)(fVar4 * (this->super_LightBase).renderFromLight.mInv.m[2]
                                                  [1])),ZEXT416((uint)fVar5),
                           ZEXT416((uint)(this->super_LightBase).renderFromLight.mInv.m[2][0]));
  auVar2 = vfmadd231ss_fma(auVar3,ZEXT416((uint)fVar6),
                           ZEXT416((uint)(this->super_LightBase).renderFromLight.mInv.m[0][2]));
  auVar1 = vfmadd231ss_fma(auVar1,ZEXT416((uint)fVar6),
                           ZEXT416((uint)(this->super_LightBase).renderFromLight.mInv.m[1][2]));
  auVar3 = vfmadd231ss_fma(auVar7,ZEXT416((uint)fVar6),
                           ZEXT416((uint)(this->super_LightBase).renderFromLight.mInv.m[2][2]));
  fVar6 = auVar2._0_4_;
  fVar8 = auVar1._0_4_;
  fVar4 = auVar3._0_4_;
  auVar3 = ZEXT416((uint)(fVar6 * fVar6 + fVar8 * fVar8 + fVar4 * fVar4));
  auVar3 = vsqrtss_avx(auVar3,auVar3);
  fVar5 = auVar3._0_4_;
  auVar3._0_4_ = fVar6 / fVar5;
  auVar3._4_12_ = auVar2._4_12_;
  auVar7._0_4_ = fVar8 / fVar5;
  auVar7._4_12_ = auVar1._4_12_;
  d.super_Tuple3<pbrt::Vector3,_float>.z = fVar4 / fVar5;
  auVar3 = vinsertps_avx(auVar3,auVar7,0x10);
  d.super_Tuple3<pbrt::Vector3,_float>._0_8_ = auVar3._0_8_;
  uv = EqualAreaSphereToSquare(d);
  SVar9 = Le(this,uv,lambda);
  return (array<float,_4>)(array<float,_4>)SVar9;
}

Assistant:

Le(const Ray &ray, const SampledWavelengths &lambda) const {
        Vector3f wl = Normalize(renderFromLight.ApplyInverse(ray.d));
        Point2f uv = EqualAreaSphereToSquare(wl);
        return Le(uv, lambda);
    }